

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

bool cmCTestSVNPathStarts(string *p1,string *p2)

{
  int iVar1;
  string *in_RCX;
  char *in_RDX;
  
  if (p2 == in_RCX) {
    if (p2 == (string *)0x0) {
      return true;
    }
    iVar1 = bcmp(p1,in_RDX,(size_t)p2);
  }
  else {
    if ((p2 <= in_RCX) ||
       (*(char *)((long)&(p1->_M_dataplus)._M_p + (long)&(in_RCX->_M_dataplus)._M_p) != '/')) {
      return false;
    }
    iVar1 = strncmp((char *)p1,in_RDX,(size_t)in_RCX);
  }
  return iVar1 == 0;
}

Assistant:

static bool cmCTestSVNPathStarts(std::string const& p1, std::string const& p2)
{
  // Does path p1 start with path p2?
  if (p1.size() == p2.size()) {
    return p1 == p2;
  }
  if (p1.size() > p2.size() && p1[p2.size()] == '/') {
    return strncmp(p1.c_str(), p2.c_str(), p2.size()) == 0;
  }
  return false;
}